

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O2

void setup_movable_item(tgestate_t *state,movableitem_t *movableitem,character_t character)

{
  spritedef_t *psVar1;
  undefined2 uVar2;
  undefined7 uVar3;
  
  state->vischars[1].character = character;
  uVar2 = *(undefined2 *)&movableitem->field_0x6;
  psVar1 = movableitem->sprite;
  state->vischars[1].mi.mappos = movableitem->mappos;
  *(undefined2 *)&state->vischars[1].mi.field_0x6 = uVar2;
  state->vischars[1].mi.sprite = psVar1;
  uVar3 = *(undefined7 *)&movableitem->field_0x11;
  state->vischars[1].mi.sprite_index = movableitem->sprite_index;
  *(undefined7 *)&state->vischars[1].mi.field_0x11 = uVar3;
  state->vischars[1].flags = '\0';
  state->vischars[1].route.index = '\0';
  state->vischars[1].route.step = '\0';
  state->vischars[1].target.u = '\0';
  state->vischars[1].target.u = '\0';
  state->vischars[1].target.v = '\0';
  state->vischars[1].target.w = '\0';
  state->vischars[1].counter_and_flags = '\0';
  state->vischars[1].animbase = animations;
  state->vischars[1].anim = animations[8];
  state->vischars[1].animindex = '\0';
  state->vischars[1].input = '\0';
  state->vischars[1].direction = '\0';
  state->vischars[1].room = state->room_index;
  calc_vischar_isopos_from_vischar(state,state->vischars + 1);
  return;
}

Assistant:

void setup_movable_item(tgestate_t          *state,
                        const movableitem_t *movableitem,
                        character_t          character)
{
  vischar_t *vischar1; /* was HL */

  assert(state       != NULL);
  assert(movableitem != NULL);
  ASSERT_CHARACTER_VALID(character);

  /* The movable item uses the first non-player visible character slot. */
  vischar1 = &state->vischars[1];

  vischar1->character         = character;
  vischar1->mi                = *movableitem;

  /* Conv: Reset data inlined. */

  vischar1->flags             = 0;
  vischar1->route.index       = routeindex_0_HALT;
  vischar1->route.step        = 0;
  vischar1->target.u          = 0;
  vischar1->target.v          = 0;
  vischar1->target.w          = 0;
  vischar1->counter_and_flags = 0;
  vischar1->animbase          = &animations[0];
  vischar1->anim              = animations[8]; /* -> anim_wait_tl animation */
  vischar1->animindex         = 0;
  vischar1->input             = 0;
  vischar1->direction         = direction_TOP_LEFT; /* == 0 */

  vischar1->room              = state->room_index;
  calc_vischar_isopos_from_vischar(state, vischar1);
}